

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

void md_analyze_entity(MD_CTX *ctx,int mark_index)

{
  long lVar1;
  MD_MARK *pMVar2;
  int iVar3;
  int in_ESI;
  MD_CTX *in_RDI;
  long in_FS_OFFSET;
  MD_MARK *closer;
  MD_MARK *opener;
  MD_OFFSET off;
  MD_OFFSET in_stack_ffffffffffffffc8;
  MD_OFFSET in_stack_ffffffffffffffcc;
  MD_CTX *ctx_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pMVar2 = in_RDI->marks;
  if (((in_ESI + 1 < in_RDI->n_marks) &&
      (ctx_00 = (MD_CTX *)(in_RDI->marks + (in_ESI + 1)), (char)(ctx_00->parser).abi_version == ';')
      ) && (iVar3 = md_is_entity(ctx_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                                 (MD_OFFSET *)0xa14778), iVar3 != 0)) {
    md_resolve_range(in_RDI,in_ESI,in_ESI + 1);
    pMVar2[in_ESI].end = *(MD_OFFSET *)((long)&ctx_00->text + 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void
md_analyze_entity(MD_CTX* ctx, int mark_index)
{
    MD_MARK* opener = &ctx->marks[mark_index];
    MD_MARK* closer;
    OFF off;

    /* Cannot be entity if there is no closer as the next mark.
     * (Any other mark between would mean strange character which cannot be
     * part of the entity.
     *
     * So we can do all the work on '&' and do not call this later for the
     * closing mark ';'.
     */
    if(mark_index + 1 >= ctx->n_marks)
        return;
    closer = &ctx->marks[mark_index+1];
    if(closer->ch != ';')
        return;

    if(md_is_entity(ctx, opener->beg, closer->end, &off)) {
        MD_ASSERT(off == closer->end);

        md_resolve_range(ctx, mark_index, mark_index+1);
        opener->end = closer->end;
    }
}